

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::PatchGetRootValueForTypeOf<false,Js::PolymorphicInlineCache>
              (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
              InlineCacheIndex inlineCacheIndex,DynamicObject *object,PropertyId propertyId)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  uint propertyId_00;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  ScriptContext *requestContext;
  RecyclableObject *pRVar6;
  RecyclableObject *pRVar7;
  undefined1 local_a8 [8];
  PropertyValueInfo info;
  AutoCatchHandlerExists autoCatchHandlerExists;
  AutoCleanup local_50;
  AutoCleanup autoCleanup;
  RecyclableObject *local_38;
  
  autoCleanup.scriptContext._4_4_ = propertyId;
  if ((((object->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) != TypeIds_GlobalObject)
  {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x1fbb,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar3) goto LAB_00ad5bbf;
    *puVar5 = 0;
  }
  requestContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  local_a8 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_a8,functionBody,inlineCache,inlineCacheIndex,true);
  local_38 = (RecyclableObject *)0x0;
  if (info._8_8_ != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x21,
                                "(IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache())",
                                "IsInlineCacheAvailable == !!propertyValueInfo->GetInlineCache()");
    if (!bVar3) goto LAB_00ad5bbf;
    *puVar5 = 0;
  }
  if (info.inlineCache == (InlineCache *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/CacheOperators.inl"
                                ,0x22,
                                "(IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache())"
                                ,
                                "IsPolymorphicInlineCacheAvailable == !!propertyValueInfo->GetPolymorphicInlineCache()"
                               );
    if (!bVar3) {
LAB_00ad5bbf:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  propertyId_00 = autoCleanup.scriptContext._4_4_;
  pRVar7 = (RecyclableObject *)(ulong)autoCleanup.scriptContext._4_4_;
  bVar3 = PolymorphicInlineCache::TryGetProperty<true,true,true,false,false,false,false>
                    ((PolymorphicInlineCache *)info.inlineCache,object,
                     &object->super_RecyclableObject,autoCleanup.scriptContext._4_4_,&local_38,
                     requestContext,(PropertyCacheOperationInfo *)0x0,(InlineCache *)0x0);
  pRVar6 = local_38;
  if (!bVar3) {
    bVar3 = Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
    if ((bVar3) && (DAT_015bc46a == '\x01')) {
      CacheOperators::TraceCache
                (inlineCache,L"PatchGetRootValueForTypeOf",propertyId_00,requestContext,
                 &object->super_RecyclableObject);
    }
    local_38 = (RecyclableObject *)0x0;
    JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex,requestContext,true);
    local_50.scriptContext = requestContext;
    bVar3 = ScriptContext::IsScriptContextInDebugMode(requestContext);
    if (bVar3) {
      ScriptContext::GetDebugContext(requestContext);
    }
    pRVar6 = VarTo<Js::RecyclableObject>(object);
    BVar4 = GetProperty_Internal<false>
                      (object,pRVar6,true,propertyId_00,&local_38,requestContext,
                       (PropertyValueInfo *)local_a8);
    if ((BVar4 != 0) &&
       (pRVar7 = local_38,
       &((((requestContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
        )->super_RecyclableObject == local_38)) {
      JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
    }
    PatchGetRootValueForTypeOf<false,_Js::PolymorphicInlineCache>::AutoCleanup::~AutoCleanup
              (&local_50);
    JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
              ((AutoCatchHandlerExists *)&info.inlineCacheIndex);
    pRVar6 = pRVar7;
    if (BVar4 == 0) {
      pJVar1 = (requestContext->super_ScriptContextBase).javascriptLibrary;
      if (&((pJVar1->undeclBlockVarSentinel).ptr)->super_RecyclableObject == local_38) {
        JavascriptError::ThrowReferenceError(requestContext,-0x7ff5ec07,(PCWSTR)0x0);
      }
      pRVar6 = (pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
  }
  return pRVar6;
}

Assistant:

Var JavascriptOperators::PatchGetRootValueForTypeOf(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject * object, PropertyId propertyId)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchGetRootValueForTypeOf);
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
        Var value = nullptr;
        if (CacheOperators::TryGetProperty<true, true, true, false, true, false, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false, false>(
            object, true, object, propertyId, &value, scriptContext, nullptr, &info))
        {
            return value;
        }

#if DBG_DUMP
        if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
        {
            CacheOperators::TraceCache(inlineCache, _u("PatchGetRootValueForTypeOf"), propertyId, scriptContext, object);
        }
#endif
        value = nullptr;
        BEGIN_TYPEOF_ERROR_HANDLER(scriptContext);
        AssertOrFailFast(VarIsCorrectType(static_cast<RecyclableObject*>(object)));
        if (JavascriptOperators::GetRootProperty(object, propertyId, &value, scriptContext, &info))
        {
            if (scriptContext->IsUndeclBlockVar(value))
            {
                JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
            }
            return value;
        }
        END_TYPEOF_ERROR_HANDLER(scriptContext, value);

        value = scriptContext->GetLibrary()->GetUndefined();
        return value;
        JIT_HELPER_END(Op_PatchGetRootValueForTypeOf);
    }